

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.h
# Opt level: O2

void __thiscall chrono::ChSystem::RemoveLink(ChSystem *this,shared_ptr<chrono::ChLinkBase> *link)

{
  __shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&link->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>);
  ChAssembly::RemoveLink(&this->assembly,(shared_ptr<chrono::ChLinkBase> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

virtual void RemoveLink(std::shared_ptr<ChLinkBase> link) { assembly.RemoveLink(link); }